

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

void OnExit(void *data)

{
  int in_ESI;
  
  PaUtil_ResetCpuLoadMeasurer((PaUtilCpuLoadMeasurer *)((long)data + 0x50));
  *(undefined4 *)((long)data + 0x23c) = 1;
  AlsaStop((PaAlsaStream *)data,in_ESI);
  if (*(code **)((long)data + 0x20) != (code *)0x0) {
    (**(code **)((long)data + 0x20))(*(undefined8 *)((long)data + 0x28));
  }
  *(undefined4 *)((long)data + 0x244) = 0;
  return;
}

Assistant:

static void OnExit( void *data )
{
    PaAlsaStream *stream = (PaAlsaStream *) data;

    assert( data );

    PaUtil_ResetCpuLoadMeasurer( &stream->cpuLoadMeasurer );

    stream->callback_finished = 1;  /* Let the outside world know stream was stopped in callback */
    PA_DEBUG(( "%s: Stopping ALSA handles\n", __FUNCTION__ ));
    AlsaStop( stream, stream->callbackAbort );

    PA_DEBUG(( "%s: Stoppage\n", __FUNCTION__ ));

    /* Eventually notify user all buffers have played */
    if( stream->streamRepresentation.streamFinishedCallback )
    {
        stream->streamRepresentation.streamFinishedCallback( stream->streamRepresentation.userData );
    }
    stream->isActive = 0;
}